

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_get_u64(CBS *cbs,uint64_t *out)

{
  int iVar1;
  size_t i;
  long lVar2;
  uint8_t *in_RCX;
  ulong uVar3;
  
  uVar3 = cbs->len;
  if (7 < uVar3) {
    in_RCX = cbs->data;
    cbs->data = in_RCX + 8;
    cbs->len = uVar3 - 8;
  }
  iVar1 = 0;
  if (7 < uVar3) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar3 = (ulong)in_RCX[lVar2] | uVar3 << 8;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    *out = uVar3;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}